

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# mgga.c
# Opt level: O0

void xc_mgga(xc_func_type *p,size_t np,double *rho,double *sigma,double *lapl,double *tau,double *zk
            ,double *vrho,double *vsigma,double *vlapl,double *vtau,double *v2rho2,
            double *v2rhosigma,double *v2rholapl,double *v2rhotau,double *v2sigma2,
            double *v2sigmalapl,double *v2sigmatau,double *v2lapl2,double *v2lapltau,double *v2tau2,
            double *v3rho3,double *v3rho2sigma,double *v3rho2lapl,double *v3rho2tau,
            double *v3rhosigma2,double *v3rhosigmalapl,double *v3rhosigmatau,double *v3rholapl2,
            double *v3rholapltau,double *v3rhotau2,double *v3sigma3,double *v3sigma2lapl,
            double *v3sigma2tau,double *v3sigmalapl2,double *v3sigmalapltau,double *v3sigmatau2,
            double *v3lapl3,double *v3lapl2tau,double *v3lapltau2,double *v3tau3,double *v4rho4,
            double *v4rho3sigma,double *v4rho3lapl,double *v4rho3tau,double *v4rho2sigma2,
            double *v4rho2sigmalapl,double *v4rho2sigmatau,double *v4rho2lapl2,double *v4rho2lapltau
            ,double *v4rho2tau2,double *v4rhosigma3,double *v4rhosigma2lapl,double *v4rhosigma2tau,
            double *v4rhosigmalapl2,double *v4rhosigmalapltau,double *v4rhosigmatau2,
            double *v4rholapl3,double *v4rholapl2tau,double *v4rholapltau2,double *v4rhotau3,
            double *v4sigma4,double *v4sigma3lapl,double *v4sigma3tau,double *v4sigma2lapl2,
            double *v4sigma2lapltau,double *v4sigma2tau2,double *v4sigmalapl3,
            double *v4sigmalapl2tau,double *v4sigmalapltau2,double *v4sigmatau3,double *v4lapl4,
            double *v4lapl3tau,double *v4lapl2tau2,double *v4lapltau3,double *v4tau4)

{
  long in_stack_00000008;
  xc_mgga_out_params out;
  int order;
  undefined1 local_268 [564];
  int local_34;
  
  local_34 = -1;
  if (in_stack_00000008 != 0) {
    local_34 = 0;
  }
  if (out.zk != (double *)0x0) {
    local_34 = 1;
  }
  if (out.vtau != (double *)0x0) {
    local_34 = 2;
  }
  if (out.v2tau2 != (double *)0x0) {
    local_34 = 3;
  }
  if (out.v3tau3 != (double *)0x0) {
    local_34 = 4;
  }
  if (-1 < local_34) {
    memset(local_268,0,0x230);
    xc_mgga_new((xc_func_type *)out.v4sigma3lapl,out.v4sigma4._4_4_,(size_t)out.v4rhotau3,
                out.v4rholapltau2,out.v4rholapl2tau,out.v4rholapl3,out.v4sigmatau3,
                (xc_mgga_out_params *)out.v4lapl4);
  }
  return;
}

Assistant:

void
xc_mgga(const xc_func_type *p, size_t np,
        const double *rho, const double *sigma, const double *lapl, const double *tau,
        double *zk,
        double *vrho, double *vsigma, double *vlapl, double *vtau,
        double *v2rho2, double *v2rhosigma, double *v2rholapl, double *v2rhotau, double *v2sigma2,
        double *v2sigmalapl, double *v2sigmatau, double *v2lapl2, double *v2lapltau, double *v2tau2,
        double *v3rho3, double *v3rho2sigma, double *v3rho2lapl, double *v3rho2tau, double *v3rhosigma2,
        double *v3rhosigmalapl, double *v3rhosigmatau, double *v3rholapl2, double *v3rholapltau,
        double *v3rhotau2, double *v3sigma3, double *v3sigma2lapl, double *v3sigma2tau,
        double *v3sigmalapl2, double *v3sigmalapltau, double *v3sigmatau2, double *v3lapl3,
        double *v3lapl2tau, double *v3lapltau2, double *v3tau3,
        double *v4rho4, double *v4rho3sigma, double *v4rho3lapl, double *v4rho3tau, double *v4rho2sigma2,
        double *v4rho2sigmalapl, double *v4rho2sigmatau, double *v4rho2lapl2, double *v4rho2lapltau,
        double *v4rho2tau2, double *v4rhosigma3, double *v4rhosigma2lapl, double *v4rhosigma2tau,
        double *v4rhosigmalapl2, double *v4rhosigmalapltau, double *v4rhosigmatau2,
        double *v4rholapl3, double *v4rholapl2tau, double *v4rholapltau2, double *v4rhotau3,
        double *v4sigma4, double *v4sigma3lapl, double *v4sigma3tau, double *v4sigma2lapl2,
        double *v4sigma2lapltau, double *v4sigma2tau2, double *v4sigmalapl3, double *v4sigmalapl2tau,
        double *v4sigmalapltau2, double *v4sigmatau3, double *v4lapl4, double *v4lapl3tau,
        double *v4lapl2tau2, double *v4lapltau3, double *v4tau4
        )
{
  int order = -1;

  if(zk     != NULL) order = 0;
  if(vrho   != NULL) order = 1;
  if(v2rho2 != NULL) order = 2;
  if(v3rho3 != NULL) order = 3;
  if(v4rho4 != NULL) order = 4;

  if(order < 0) return;

  xc_mgga_out_params out;
  libxc_memset(&out, 0, sizeof(xc_mgga_out_params));

  SET_ORDER_0;
  SET_ORDER_1;
  SET_ORDER_2;
  SET_ORDER_3;
  SET_ORDER_4;

  /* call new API */
  xc_mgga_new(p, order, np, rho, sigma, lapl, tau, &out);
}